

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UdpEntrySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpEntrySyntax,slang::syntax::TokenList_const&,slang::syntax::UdpEdgeIndicatorSyntax*&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,TokenList *args,UdpEdgeIndicatorSyntax **args_1,TokenList *args_2,
          Token *args_3,Token *args_4,Token *args_5,Token *args_6,Token *args_7)

{
  UdpEdgeIndicatorSyntax *pUVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  size_type sVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  UdpEntrySyntax *pUVar30;
  
  pUVar30 = (UdpEntrySyntax *)allocate(this,200,8);
  pUVar1 = *args_1;
  TVar10 = args_3->kind;
  uVar11 = args_3->field_0x2;
  NVar12.raw = (args_3->numFlags).raw;
  uVar13 = args_3->rawLen;
  pIVar2 = args_3->info;
  TVar14 = args_4->kind;
  uVar15 = args_4->field_0x2;
  NVar16.raw = (args_4->numFlags).raw;
  uVar17 = args_4->rawLen;
  pIVar3 = args_4->info;
  TVar18 = args_5->kind;
  uVar19 = args_5->field_0x2;
  NVar20.raw = (args_5->numFlags).raw;
  uVar21 = args_5->rawLen;
  pIVar4 = args_5->info;
  TVar22 = args_6->kind;
  uVar23 = args_6->field_0x2;
  NVar24.raw = (args_6->numFlags).raw;
  uVar25 = args_6->rawLen;
  pIVar5 = args_6->info;
  TVar26 = args_7->kind;
  uVar27 = args_7->field_0x2;
  NVar28.raw = (args_7->numFlags).raw;
  uVar29 = args_7->rawLen;
  pIVar6 = args_7->info;
  (pUVar30->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pUVar30->super_SyntaxNode).kind = UdpEntry;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pUVar30->preInputs).super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pUVar30->preInputs).super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pUVar30->preInputs).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9;
  (pUVar30->preInputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (pUVar30->preInputs).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar7 = (args->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pUVar30->preInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pUVar30->preInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar7;
  (pUVar30->preInputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0046feb0;
  pUVar30->edgeIndicator = pUVar1;
  SVar8 = (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pUVar30->postInputs).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pUVar30->postInputs).super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pUVar30->postInputs).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9;
  (pUVar30->postInputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (pUVar30->postInputs).super_SyntaxListBase.childCount = (args_2->super_SyntaxListBase).childCount;
  sVar7 = (args_2->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pUVar30->postInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args_2->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pUVar30->postInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar7;
  (pUVar30->postInputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0046feb0;
  (pUVar30->colon1).kind = TVar10;
  (pUVar30->colon1).field_0x2 = uVar11;
  (pUVar30->colon1).numFlags = (NumericTokenFlags)NVar12.raw;
  (pUVar30->colon1).rawLen = uVar13;
  (pUVar30->colon1).info = pIVar2;
  (pUVar30->current).kind = TVar14;
  (pUVar30->current).field_0x2 = uVar15;
  (pUVar30->current).numFlags = (NumericTokenFlags)NVar16.raw;
  (pUVar30->current).rawLen = uVar17;
  (pUVar30->current).info = pIVar3;
  (pUVar30->colon2).kind = TVar18;
  (pUVar30->colon2).field_0x2 = uVar19;
  (pUVar30->colon2).numFlags = (NumericTokenFlags)NVar20.raw;
  (pUVar30->colon2).rawLen = uVar21;
  (pUVar30->colon2).info = pIVar4;
  (pUVar30->next).kind = TVar22;
  (pUVar30->next).field_0x2 = uVar23;
  (pUVar30->next).numFlags = (NumericTokenFlags)NVar24.raw;
  (pUVar30->next).rawLen = uVar25;
  (pUVar30->next).info = pIVar5;
  (pUVar30->semi).kind = TVar26;
  (pUVar30->semi).field_0x2 = uVar27;
  (pUVar30->semi).numFlags = (NumericTokenFlags)NVar28.raw;
  (pUVar30->semi).rawLen = uVar29;
  (pUVar30->semi).info = pIVar6;
  (pUVar30->preInputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pUVar30;
  if (pUVar1 != (UdpEdgeIndicatorSyntax *)0x0) {
    (pUVar1->super_SyntaxNode).parent = (SyntaxNode *)pUVar30;
  }
  (pUVar30->postInputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pUVar30;
  return pUVar30;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }